

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebugIfHasDebugStreamContainer<QList<QByteArray>,_QByteArray>
operator<<(QDebug *debug,QList<QByteArray> *vec)

{
  Stream *in_RDI;
  long in_FS_OFFSET;
  Stream *c;
  QDebug in_stack_fffffffffffffff0;
  QDebug *debug_00;
  
  debug_00 = *(QDebug **)(in_FS_OFFSET + 0x28);
  c = in_RDI;
  QDebug::QDebug((QDebug *)&stack0xfffffffffffffff0,(QDebug *)in_RDI);
  QtPrivate::printSequentialContainer<QList<QByteArray>>
            (debug_00,(char *)in_stack_fffffffffffffff0.stream,(QList<QByteArray> *)c);
  QDebug::~QDebug(debug_00);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == debug_00) {
    return (QDebugIfHasDebugStreamContainer<QList<QByteArray>,_QByteArray>)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QList<T>, T> operator<<(QDebug debug, const QList<T> &vec)
{
    return QtPrivate::printSequentialContainer(std::move(debug), "QList", vec);
}